

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared_context.cpp
# Opt level: O0

void __thiscall
Clasp::ShortImplicationsGraph::Block::addUnlock(Block *this,uint32 lockedSize,Literal *x,uint32 xs)

{
  __int_type in_ECX;
  __atomic_base<unsigned_int> *in_RDX;
  undefined4 in_ESI;
  undefined4 in_stack_ffffffffffffffe0;
  undefined4 in_stack_fffffffffffffff0;
  
  std::copy<Clasp::Literal_const*,Clasp::Literal*>
            ((Literal *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),(Literal *)in_RDX,
             (Literal *)CONCAT44(in_ECX,in_stack_ffffffffffffffe0));
  std::__atomic_base<unsigned_int>::operator=(in_RDX,in_ECX);
  return;
}

Assistant:

void ShortImplicationsGraph::Block::addUnlock(uint32 lockedSize, const Literal* x, uint32 xs) {
	std::copy(x, x+xs, data+lockedSize);
	size_lock = ((lockedSize+xs) << 1);
}